

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O2

int JacVI(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *user_data,N_Vector tmp1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  int iVar6;
  undefined8 uVar7;
  void *flagvalue;
  void *flagvalue_00;
  void *flagvalue_01;
  void *flagvalue_02;
  void *flagvalue_03;
  void *flagvalue_04;
  undefined8 *flagvalue_05;
  undefined8 *flagvalue_06;
  undefined8 *flagvalue_07;
  int iVar8;
  long lVar9;
  
  lVar5 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x38);
  uVar7 = N_VGetSubvector_ManyVector(y,0);
  flagvalue = (void *)N_VGetArrayPointer(uVar7);
  iVar6 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  iVar8 = 1;
  if (iVar6 == 0) {
    uVar7 = N_VGetSubvector_ManyVector(y,1);
    flagvalue_00 = (void *)N_VGetArrayPointer(uVar7);
    iVar6 = check_flag(flagvalue_00,"N_VGetArrayPointer",0);
    if (iVar6 == 0) {
      uVar7 = N_VGetSubvector_ManyVector(y,2);
      flagvalue_01 = (void *)N_VGetArrayPointer(uVar7);
      iVar6 = check_flag(flagvalue_01,"N_VGetArrayPointer",0);
      if (iVar6 == 0) {
        uVar7 = N_VGetSubvector_ManyVector(v,0);
        flagvalue_02 = (void *)N_VGetArrayPointer(uVar7);
        iVar6 = check_flag(flagvalue_02,"N_VGetArrayPointer",0);
        if (iVar6 == 0) {
          uVar7 = N_VGetSubvector_ManyVector(v,1);
          flagvalue_03 = (void *)N_VGetArrayPointer(uVar7);
          iVar6 = check_flag(flagvalue_03,"N_VGetArrayPointer",0);
          if (iVar6 == 0) {
            uVar7 = N_VGetSubvector_ManyVector(v,2);
            flagvalue_04 = (void *)N_VGetArrayPointer(uVar7);
            iVar6 = check_flag(flagvalue_04,"N_VGetArrayPointer",0);
            if (iVar6 == 0) {
              uVar7 = N_VGetSubvector_ManyVector(Jv,0);
              flagvalue_05 = (undefined8 *)N_VGetArrayPointer(uVar7);
              iVar6 = check_flag(flagvalue_05,"N_VGetArrayPointer",0);
              if (iVar6 == 0) {
                lVar9 = 1;
                uVar7 = N_VGetSubvector_ManyVector(Jv,1);
                flagvalue_06 = (undefined8 *)N_VGetArrayPointer(uVar7);
                iVar6 = check_flag(flagvalue_06,"N_VGetArrayPointer",0);
                if (iVar6 == 0) {
                  uVar7 = N_VGetSubvector_ManyVector(Jv,2);
                  flagvalue_07 = (undefined8 *)N_VGetArrayPointer(uVar7);
                  iVar6 = check_flag(flagvalue_07,"N_VGetArrayPointer",0);
                  if (iVar6 == 0) {
                    N_VConst(0,Jv);
                    for (; lVar9 < lVar5 + -1; lVar9 = lVar9 + 1) {
                      dVar2 = *(double *)((long)flagvalue + lVar9 * 8);
                      dVar3 = *(double *)((long)flagvalue_02 + lVar9 * 8);
                      dVar4 = *(double *)((long)flagvalue_00 + lVar9 * 8);
                      flagvalue_05[lVar9] =
                           (dVar4 + dVar4) * dVar2 * dVar3 +
                           *(double *)((long)flagvalue_03 + lVar9 * 8) * dVar2 * dVar2 +
                           ((-*(double *)((long)flagvalue_04 + lVar9 * 8) * dVar2 -
                            *(double *)((long)flagvalue_01 + lVar9 * 8) * dVar3) - dVar3);
                      dVar2 = *(double *)((long)flagvalue + lVar9 * 8);
                      dVar3 = *(double *)((long)flagvalue_02 + lVar9 * 8);
                      flagvalue_06[lVar9] =
                           *(double *)((long)flagvalue_00 + lVar9 * 8) * -2.0 * dVar2 * dVar3 +
                           ((*(double *)((long)flagvalue_04 + lVar9 * 8) * dVar2 +
                            *(double *)((long)flagvalue_01 + lVar9 * 8) * dVar3) -
                           *(double *)((long)flagvalue_03 + lVar9 * 8) * dVar2 * dVar2);
                      dVar2 = *(double *)((long)flagvalue_04 + lVar9 * 8);
                      flagvalue_07[lVar9] =
                           (-dVar2 * *(double *)((long)flagvalue + lVar9 * 8) - dVar2 / dVar1) -
                           *(double *)((long)flagvalue_01 + lVar9 * 8) *
                           *(double *)((long)flagvalue_02 + lVar9 * 8);
                    }
                    *flagvalue_07 = 0;
                    *flagvalue_06 = 0;
                    *flagvalue_05 = 0;
                    flagvalue_07[lVar5 + -1] = 0;
                    flagvalue_06[lVar5 + -1] = 0;
                    flagvalue_05[lVar5 + -1] = 0;
                    iVar8 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

static int JacVI(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y,
                 N_Vector fy, void* user_data, N_Vector tmp1)
{
  UserData userdata = (UserData)user_data; /* access problem data */
  sunindextype N    = userdata->N;         /* set variable shortcuts */
  sunrealtype ep    = userdata->ep;
  sunrealtype *y_u = NULL, *y_v = NULL, *y_w = NULL;
  sunrealtype *v_u = NULL, *v_v = NULL, *v_w = NULL;
  sunrealtype *Ju_v = NULL, *Jv_v = NULL, *Jw_v = NULL;
  sunindextype i;

  y_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 0));
  if (check_flag((void*)y_u, "N_VGetArrayPointer", 0)) { return 1; }
  y_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 1));
  if (check_flag((void*)y_v, "N_VGetArrayPointer", 0)) { return 1; }
  y_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 2));
  if (check_flag((void*)y_w, "N_VGetArrayPointer", 0)) { return 1; }

  v_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(v, 0));
  if (check_flag((void*)v_u, "N_VGetArrayPointer", 0)) { return 1; }
  v_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(v, 1));
  if (check_flag((void*)v_v, "N_VGetArrayPointer", 0)) { return 1; }
  v_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(v, 2));
  if (check_flag((void*)v_w, "N_VGetArrayPointer", 0)) { return 1; }

  Ju_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(Jv, 0));
  if (check_flag((void*)Ju_v, "N_VGetArrayPointer", 0)) { return 1; }
  Jv_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(Jv, 1));
  if (check_flag((void*)Jv_v, "N_VGetArrayPointer", 0)) { return 1; }
  Jw_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(Jv, 2));
  if (check_flag((void*)Jw_v, "N_VGetArrayPointer", 0)) { return 1; }

  N_VConst(ZERO, Jv); /* initialize Jv to zero */

  /* iterate over domain, computing Jacobian-vector products */
  for (i = 1; i < N - 1; i++)
  {
    /* Fill in Jacobian-vector product for Ju*v */
    Ju_v[i] = -v_w[i] * y_u[i] - y_w[i] * v_u[i] - v_u[i] +
              v_v[i] * y_u[i] * y_u[i] + TWO * y_v[i] * y_u[i] * v_u[i];

    /* Fill in Jacobian-vector product for Jv*v */
    Jv_v[i] = v_w[i] * y_u[i] + y_w[i] * v_u[i] - v_v[i] * y_u[i] * y_u[i] -
              TWO * y_v[i] * y_u[i] * v_u[i];

    /* Fill in Jacobian-vector product for Jw*v */
    Jw_v[i] = -v_w[i] / ep - v_w[i] * y_u[i] - y_w[i] * v_u[i];
  }

  /* enforce stationary boundaries */
  Ju_v[0] = Jv_v[0] = Jw_v[0] = ZERO;
  Ju_v[N - 1] = Jv_v[N - 1] = Jw_v[N - 1] = ZERO;

  return 0; /* Return with success */
}